

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall jsonnet::internal::SortImports::sortGroup(SortImports *this,ImportElems *imports)

{
  bool bVar1;
  iterator __last;
  __normal_iterator<jsonnet::internal::SortImports::ImportElem_*,_std::vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>_>
  in_RSI;
  ImportElems *in_stack_00000058;
  SortImports *in_stack_00000060;
  vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
  *in_stack_ffffffffffffffd8;
  
  bVar1 = duplicatedVariables(in_stack_00000060,in_stack_00000058);
  if (!bVar1) {
    __last = std::
             vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
             ::begin(in_stack_ffffffffffffffd8);
    std::
    vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
    ::end(in_stack_ffffffffffffffd8);
    std::
    sort<__gnu_cxx::__normal_iterator<jsonnet::internal::SortImports::ImportElem*,std::vector<jsonnet::internal::SortImports::ImportElem,std::allocator<jsonnet::internal::SortImports::ImportElem>>>>
              (in_RSI,(__normal_iterator<jsonnet::internal::SortImports::ImportElem_*,_std::vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>_>
                       )__last._M_current);
  }
  return;
}

Assistant:

void sortGroup(ImportElems &imports)
    {
        // We don't want to change behaviour in such case:
        // local foo = "b.jsonnet";
        // local foo = "a.jsonnet";
        // So we don't change the order when there are shadowed variables.
        if (!duplicatedVariables(imports)) {
            std::sort(imports.begin(), imports.end());
        }
    }